

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcColumnType::~IfcColumnType(IfcColumnType *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)&this[-1].field_0x48 = 0x933108;
  *(undefined8 *)&this->field_0x30 = 0x933220;
  *(undefined8 *)&this[-1].field_0xd0 = 0x933130;
  *(undefined8 *)&this[-1].field_0xe0 = 0x933158;
  *(undefined8 *)&this[-1].field_0x138 = 0x933180;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcColumnType,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x9331a8;
  *(undefined8 *)&this[-1].field_0x1c8 = 0x9331d0;
  *(undefined8 *)this = 0x9331f8;
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10);
  }
  *(undefined8 *)&this[-1].field_0x48 = 0x9334e8;
  *(undefined8 *)&this->field_0x30 = 0x9335b0;
  *(undefined8 *)&this[-1].field_0xd0 = 0x933510;
  *(undefined8 *)&this[-1].field_0xe0 = 0x933538;
  *(undefined8 *)&this[-1].field_0x138 = 0x933560;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcColumnType,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x933588;
  puVar1 = *(undefined1 **)
            &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcColumnType,_1UL>.field_0x10;
  if (puVar1 != &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcColumnType,_1UL>.field_0x20
     ) {
    operator_delete(puVar1);
  }
  IfcTypeProduct::~IfcTypeProduct
            ((IfcTypeProduct *)&this[-1].field_0x48,&PTR_construction_vtable_24__00933248);
  operator_delete(&this[-1].field_0x48);
  return;
}

Assistant:

IfcColumnType() : Object("IfcColumnType") {}